

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall
mkvmuxer::Segment::MoveCuesBeforeClustersHelper
          (Segment *this,uint64_t diff,int32_t index,uint64_t *cues_size)

{
  CuePoint **ppCVar1;
  CuePoint *this_00;
  int32 iVar2;
  int32 iVar3;
  uint64_t uVar4;
  uint64 uVar5;
  uint64_t value;
  uint64 uVar6;
  int32_t i;
  int index_00;
  long lVar7;
  
  ppCVar1 = (this->cues_).cue_entries_;
  if (((ppCVar1 != (CuePoint **)0x0) && (index < (this->cues_).cue_entries_size_)) &&
     (this_00 = ppCVar1[index], this_00 != (CuePoint *)0x0)) {
    uVar4 = CuePoint::PayloadSize(this_00);
    uVar5 = EbmlMasterElementSize(0xbb,uVar4);
    this_00->cluster_pos_ = this_00->cluster_pos_ + diff;
    value = CuePoint::PayloadSize(this_00);
    uVar6 = EbmlMasterElementSize(0xbb,value);
    lVar7 = (value - (uVar5 + uVar4)) + uVar6;
    iVar2 = GetCodedUIntSize(*cues_size + lVar7);
    iVar3 = GetCodedUIntSize(*cues_size);
    *cues_size = *cues_size + lVar7;
    uVar4 = (iVar2 - iVar3) + lVar7;
    if ((uVar4 != 0) && (0 < (this->cues_).cue_entries_size_)) {
      index_00 = 0;
      do {
        MoveCuesBeforeClustersHelper(this,uVar4,index_00,cues_size);
        index_00 = index_00 + 1;
      } while (index_00 < (this->cues_).cue_entries_size_);
    }
  }
  return;
}

Assistant:

CuePoint* Cues::GetCueByIndex(int32_t index) const {
  if (cue_entries_ == NULL)
    return NULL;

  if (index >= cue_entries_size_)
    return NULL;

  return cue_entries_[index];
}